

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateDefaultBoxedObject_TTD(JavascriptLibrary *this,TypeId kind)

{
  code *pcVar1;
  bool bVar2;
  JavascriptNumberObject *pJVar3;
  JavascriptSymbolObject *pJVar4;
  JavascriptStringObject *pJVar5;
  undefined4 *puVar6;
  Recycler *alloc;
  JavascriptBooleanObject *this_00;
  TrackAllocData TStack_40;
  
  if ((int)kind < 0x27) {
    if (kind == TypeIds_BooleanObject) {
      if ((this->booleanTypeDynamic).ptr == (DynamicType *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                    ,0x1b73,"(booleanTypeDynamic)","Where\'s booleanTypeDynamic?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      TStack_40.typeinfo = (type_info *)&JavascriptBooleanObject::typeinfo;
      TStack_40.plusSize = 0;
      TStack_40.count = 0xffffffffffffffff;
      TStack_40.filename =
           "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
      ;
      TStack_40.line = 0x1b74;
      alloc = Memory::Recycler::TrackAllocInfo(this->recycler,&TStack_40);
      this_00 = (JavascriptBooleanObject *)new<Memory::Recycler>(0x28,alloc,0x38bbb2);
      JavascriptBooleanObject::JavascriptBooleanObject
                (this_00,(JavascriptBoolean *)0x0,(this->booleanTypeDynamic).ptr);
      return (RecyclableObject *)this_00;
    }
    if (kind == TypeIds_NumberObject) {
      pJVar3 = CreateNumberObject(this,&DAT_1000000000000);
      return (RecyclableObject *)pJVar3;
    }
  }
  else {
    if (kind == TypeIds_StringObject) {
      pJVar5 = CreateStringObject(this,(JavascriptString *)0x0);
      return (RecyclableObject *)pJVar5;
    }
    if (kind == TypeIds_SymbolObject) {
      pJVar4 = CreateSymbolObject(this,(JavascriptSymbol *)0x0);
      return (RecyclableObject *)pJVar4;
    }
  }
  TTDAbort_unrecoverable_error("Unsupported nullptr value boxed object.");
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateDefaultBoxedObject_TTD(Js::TypeId kind)
    {
        switch(kind)
        {
        case Js::TypeIds_BooleanObject:
            return this->CreateBooleanObject();
        case Js::TypeIds_NumberObject:
            return this->CreateNumberObject(Js::TaggedInt::ToVarUnchecked(0));
        case Js::TypeIds_StringObject:
            return this->CreateStringObject(nullptr);
        case Js::TypeIds_SymbolObject:
            return this->CreateSymbolObject(nullptr);
        default:
            TTDAssert(false, "Unsupported nullptr value boxed object.");
            return nullptr;
        }
    }